

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixture_unittests.h
# Opt level: O1

bool __thiscall Hasher::operator()(Hasher *this,string *a,string *b)

{
  size_t __n;
  int iVar1;
  
  this->num_compares_ = this->num_compares_ + 1;
  __n = a->_M_string_length;
  if (__n != b->_M_string_length) {
    return false;
  }
  if (__n != 0) {
    iVar1 = bcmp((a->_M_dataplus)._M_p,(b->_M_dataplus)._M_p,__n);
    return iVar1 == 0;
  }
  return true;
}

Assistant:

bool operator()(const string& a, const string& b) const {
    num_compares_++;
    return a == b;
  }